

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O3

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  _Rb_tree_header *p_Var1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  long lVar2;
  LocalSet *pLVar3;
  undefined1 auVar4 [16];
  LocalGet *pLVar5;
  bool bVar6;
  LocalGet *pLVar7;
  Expression *pEVar8;
  mapped_type *pppEVar9;
  LocalSet *this_01;
  _Base_ptr p_Var10;
  Type TVar11;
  long lVar12;
  Type *pTVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  undefined1 auVar16 [8];
  Type in_R8;
  undefined1 local_e0 [8];
  FindAll<wasm::LocalGet> gets;
  Iterator ret_1;
  Builder local_88;
  Builder builder;
  undefined1 local_78 [8];
  Iterator __begin3;
  LocalSet *local_50;
  Expression *value;
  Index local_3c;
  LocalGet *local_38;
  
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_e0,this->func->body);
  if (local_e0 !=
      (undefined1  [8])
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    builder.wasm = (Module *)&graph->locations;
    p_Var1 = &(graph->locations)._M_t._M_impl.super__Rb_tree_header;
    this_00 = &this->functionPrepends;
    auVar16 = local_e0;
    value = (Expression *)this;
    do {
      local_38 = *(LocalGet **)auVar16;
      pLVar7 = (LocalGet *)LocalGraph::getSets(graph,local_38);
      pLVar5 = local_38;
      lVar2 = *(long *)&pLVar7[2].index;
      lVar12 = lVar2;
      if (lVar2 == 0) {
        lVar12 = *(long *)&(pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).
                           super_Expression;
      }
      if (lVar12 != 0) {
        if (lVar12 == 1) {
          lVar12 = lVar2;
          if (lVar2 != 0) {
            lVar12 = *(long *)&pLVar7[2].super_SpecificExpression<(wasm::Expression::Id)8>.
                               super_Expression;
          }
          pTVar13 = (Type *)(lVar12 + 0x20);
          if (lVar2 == 0) {
            pTVar13 = &(pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                       type;
          }
          if (pTVar13->id == 0) {
            bVar6 = Function::isParam(this->func,local_38->index);
            this = (SSAify *)value;
            if (!bVar6) {
              local_78 = (undefined1  [8])
                         (local_38->super_SpecificExpression<(wasm::Expression::Id)8>).
                         super_Expression.type.id;
              bVar6 = wasm::Type::isDefaultable((Type *)local_78);
              this = (SSAify *)value;
              if (bVar6) {
                pTVar13 = &(local_38->super_SpecificExpression<(wasm::Expression::Id)8>).
                           super_Expression.type;
                pEVar8 = LiteralUtils::makeZero((Type)pTVar13->id,*(Module **)(value + 6));
                local_78 = (undefined1  [8])local_38;
                pppEVar9 = std::
                           map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                           ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                         *)builder.wasm,(key_type *)local_78);
                **pppEVar9 = pEVar8;
                bVar6 = wasm::Type::hasPredicate<&(wasm::Type::isRef()const)>(pTVar13);
                this = (SSAify *)value;
                if (bVar6) {
                  *(undefined1 *)&value[8].type.id = 1;
                }
              }
            }
          }
          else {
            local_38->index = *(Index *)(pTVar13->id + 0x10);
          }
        }
        else if (this->allowMerges == true) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (local_38->super_SpecificExpression<(wasm::Expression::Id)8>).
                         super_Expression.type.id;
          __begin3.flexibleIterator._M_node._4_4_ =
               Builder::addVar((Builder *)this->func,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
          local_3c = pLVar5->index;
          pLVar5->index = __begin3.flexibleIterator._M_node._4_4_;
          local_88.wasm = this->module;
          __begin3.parent._0_1_ = *(long *)&pLVar7[2].index == 0;
          __begin3.fixedIndex = 0;
          gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pLVar7;
          local_78 = (undefined1  [8])pLVar7;
          if ((bool)(char)__begin3.parent) {
            __begin3.usingFixed = false;
            __begin3._9_7_ = 0;
          }
          else {
            __begin3.fixedIndex =
                 *(size_t *)
                  &pLVar7[2].super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression;
          }
          while (bVar6 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ::
                         IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                         ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                       *)local_78,
                                      (Iterator *)
                                      &gets.list.
                                       super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar6)
          {
            plVar14 = (long *)(__begin3.fixedIndex + 0x20);
            if ((char)__begin3.parent != '\0') {
              plVar14 = (long *)((long)local_78 + __begin3._8_8_ * 8 + 8);
            }
            lVar2 = *plVar14;
            if (lVar2 == 0) {
              bVar6 = Function::isParam(this->func,local_3c);
              if (bVar6) {
                TVar11 = Function::getLocalType(this->func,local_3c);
                pEVar8 = (Expression *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x18,8);
                pEVar8->_id = LocalGetId;
                *(Index *)(pEVar8 + 1) = local_3c;
                (pEVar8->type).id = TVar11.id;
                local_50 = Builder::makeLocalSet
                                     (&local_88,__begin3.flexibleIterator._M_node._4_4_,pEVar8);
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)this_00,
                           (Expression **)&local_50);
              }
            }
            else {
              pLVar3 = *(LocalSet **)(lVar2 + 0x18);
              TVar11.id = (local_38->super_SpecificExpression<(wasm::Expression::Id)8>).
                          super_Expression.type.id;
              local_50 = pLVar3;
              this_01 = (LocalSet *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x20,8);
              (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id =
                   LocalSetId;
              (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
                   = 0;
              this_01->index = __begin3.flexibleIterator._M_node._4_4_;
              this_01->value = (Expression *)pLVar3;
              LocalSet::makeTee(this_01,TVar11);
              *(mapped_type)(lVar2 + 0x18) = (Expression *)this_01;
              p_Var10 = (graph->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              this = (SSAify *)value;
              if (p_Var10 != (_Base_ptr)0x0) {
                p_Var15 = &p_Var1->_M_header;
                do {
                  if (*(LocalSet **)(p_Var10 + 1) >= local_50) {
                    p_Var15 = p_Var10;
                  }
                  p_Var10 = (&p_Var10->_M_left)[*(LocalSet **)(p_Var10 + 1) < local_50];
                } while (p_Var10 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
                   ((LocalSet *)((_Rb_tree_header *)p_Var15)->_M_node_count <= local_50)) {
                  pppEVar9 = std::
                             map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                             ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                           *)builder.wasm,(key_type *)&local_50);
                  if (*pppEVar9 != (mapped_type)(lVar2 + 0x18)) {
                    __assert_fail("graph.locations[value] == &set->value",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SSAify.cpp"
                                  ,0xb6,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
                  }
                  pppEVar9 = std::
                             map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                             ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                           *)builder.wasm,(key_type *)&local_50);
                  *pppEVar9 = &this_01->value;
                  this = (SSAify *)value;
                }
              }
            }
            if ((char)__begin3.parent == '\x01') {
              __begin3._8_8_ = __begin3._8_8_ + 1;
            }
            else {
              __begin3.fixedIndex =
                   std::_Rb_tree_increment((_Rb_tree_node_base *)__begin3.fixedIndex);
            }
          }
        }
      }
      auVar16 = (undefined1  [8])((long)auVar16 + 8);
    } while (auVar16 !=
             (undefined1  [8])
             gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e0,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_e0);
  }
  return;
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSets(get);
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
            // If we replace a local.get with a null then we are refining the
            // type that the parent receives to a bottom type.
            if (get->type.hasRef()) {
              refinalize = true;
            }
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }